

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.cc
# Opt level: O2

void CRYPTO_BUFFER_free(CRYPTO_BUFFER *buf)

{
  CRYPTO_BUFFER_POOL *pCVar1;
  int iVar2;
  CRYPTO_BUFFER *pCVar3;
  
  if (buf == (CRYPTO_BUFFER *)0x0) {
    return;
  }
  pCVar1 = buf->pool;
  if (pCVar1 == (CRYPTO_BUFFER_POOL *)0x0) {
    iVar2 = CRYPTO_refcount_dec_and_test_zero(&buf->references);
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    CRYPTO_MUTEX_lock_write(&pCVar1->lock);
    iVar2 = CRYPTO_refcount_dec_and_test_zero(&buf->references);
    if (iVar2 == 0) {
      CRYPTO_MUTEX_unlock_write(&buf->pool->lock);
      return;
    }
    pCVar3 = lh_CRYPTO_BUFFER_retrieve(pCVar1->bufs,buf);
    if ((pCVar3 == buf) && (pCVar3 = lh_CRYPTO_BUFFER_delete(pCVar1->bufs,buf), pCVar3 != buf)) {
      __assert_fail("found == buf",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool.cc"
                    ,0xeb,"void CRYPTO_BUFFER_free(CRYPTO_BUFFER *)");
    }
    CRYPTO_MUTEX_unlock_write(&buf->pool->lock);
  }
  crypto_buffer_free_object(buf);
  return;
}

Assistant:

void CRYPTO_BUFFER_free(CRYPTO_BUFFER *buf) {
  if (buf == NULL) {
    return;
  }

  CRYPTO_BUFFER_POOL *const pool = buf->pool;
  if (pool == NULL) {
    if (CRYPTO_refcount_dec_and_test_zero(&buf->references)) {
      // If a reference count of zero is observed, there cannot be a reference
      // from any pool to this buffer and thus we are able to free this
      // buffer.
      crypto_buffer_free_object(buf);
    }

    return;
  }

  CRYPTO_MUTEX_lock_write(&pool->lock);
  if (!CRYPTO_refcount_dec_and_test_zero(&buf->references)) {
    CRYPTO_MUTEX_unlock_write(&buf->pool->lock);
    return;
  }

  // We have an exclusive lock on the pool, therefore no concurrent lookups can
  // find this buffer and increment the reference count. Thus, if the count is
  // zero there are and can never be any more references and thus we can free
  // this buffer.
  //
  // Note it is possible |buf| is no longer in the pool, if it was replaced by a
  // static version. If that static version was since removed, it is even
  // possible for |found| to be NULL.
  CRYPTO_BUFFER *found = lh_CRYPTO_BUFFER_retrieve(pool->bufs, buf);
  if (found == buf) {
    found = lh_CRYPTO_BUFFER_delete(pool->bufs, buf);
    assert(found == buf);
    (void)found;
  }

  CRYPTO_MUTEX_unlock_write(&buf->pool->lock);
  crypto_buffer_free_object(buf);
}